

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void __thiscall
QTextDocumentLayoutPrivate::drawBlock
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextBlock *bl,bool inRootFrame)

{
  QTextCursor *this_00;
  double dVar1;
  Selection *pSVar2;
  QTextDocument *this_01;
  qreal qVar3;
  double dVar4;
  qreal qVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Style SVar11;
  QTextLayout *this_02;
  QDebug *pQVar12;
  QTextFrame *pQVar13;
  QTextFrameData *pQVar14;
  QTextCharFormat *pQVar15;
  ulong uVar16;
  QTextObject *pQVar17;
  QPen *p;
  QColor *pQVar18;
  QTextCharFormat *selectionFormat;
  QTextFormat *pQVar19;
  long lVar20;
  int iVar21;
  Type TVar22;
  long in_FS_OFFSET;
  char *pcVar23;
  QTextLine QVar24;
  QPointF QVar25;
  QSizeF QVar26;
  QTextLength QVar27;
  undefined1 local_108 [8];
  QPen oldPen;
  QBrush local_f8;
  QBrush bg;
  QRectF local_e8;
  QPointF local_c0;
  QDebug local_b0;
  undefined1 local_a8 [12];
  undefined4 uStack_9c;
  qint32 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  char *pcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = QTextBlock::layout(bl);
  local_98 = -1;
  uStack_94 = 0xffffffff;
  uStack_90 = 0xffffffff;
  uStack_8c = 0xffffffff;
  local_a8._8_4_ = 0xffffffff;
  local_a8._0_8_ = 0xffffffffffffffff;
  uStack_9c = 0xffffffff;
  QTextLayout::boundingRect((QRectF *)local_a8,this_02);
  QVar25 = QTextLayout::position(this_02);
  dVar4 = QVar25.yp + offset->yp + (double)stack0xffffffffffffff60;
  local_a8._8_4_ = SUB84(dVar4,0);
  local_a8._0_8_ = QVar25.xp + offset->xp + (double)local_a8._0_8_;
  uStack_9c = (int)((ulong)dVar4 >> 0x20);
  bVar6 = QTextBlock::isVisible(bl);
  local_58._0_8_ = (QTextFormatPrivate *)CONCAT44(local_58._4_4_,local_58._0_4_);
  local_58._16_8_ = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_);
  if (!bVar6) goto LAB_004731e6;
  if ((0.0 < (context->clip).w) && (dVar4 = (context->clip).h, 0.0 < dVar4)) {
    dVar1 = (context->clip).yp;
    local_58._0_8_ = (QTextFormatPrivate *)CONCAT44(local_58._4_4_,local_58._0_4_);
    local_58._16_8_ = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_);
    if (((double)CONCAT44(uStack_8c,uStack_90) + (double)stack0xffffffffffffff60 < dVar1) ||
       (local_58._0_8_ = (QTextFormatPrivate *)CONCAT44(local_58._4_4_,local_58._0_4_),
       local_58._16_8_ = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_),
       dVar4 + dVar1 < (double)stack0xffffffffffffff60)) goto LAB_004731e6;
  }
  lcDraw();
  if (((byte)lcDraw::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58._0_4_ = PercentageLength;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    pcStack_40 = lcDraw::category.name;
    QMessageLogger::debug();
    pQVar12 = QDebug::operator<<((QDebug *)local_68,"drawBlock");
    iVar7 = QTextBlock::position(bl);
    pQVar12 = QDebug::operator<<(pQVar12,iVar7);
    pQVar12 = QDebug::operator<<(pQVar12,"at");
    local_c0.xp = (qreal)pQVar12->stream;
    ((Stream *)local_c0.xp)->ref = ((Stream *)local_c0.xp)->ref + 1;
    ::operator<<((QDebug *)&local_88,&local_c0);
    pQVar12 = QDebug::operator<<((QDebug *)&local_88,"br");
    local_c0.yp = (qreal)pQVar12->stream;
    ((Stream *)local_c0.yp)->ref = ((Stream *)local_c0.yp)->ref + 1;
    QTextLayout::boundingRect(&local_e8,this_02);
    ::operator<<((QDebug *)&local_b0,(QRectF *)&local_c0.yp);
    QDebug::~QDebug(&local_b0);
    QDebug::~QDebug((QDebug *)&local_c0.yp);
    QDebug::~QDebug((QDebug *)&local_88);
    QDebug::~QDebug((QDebug *)&local_c0);
    QDebug::~QDebug((QDebug *)local_68);
  }
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat((QTextBlock *)local_68);
  bg.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::background((QTextFormat *)&bg);
  local_58._0_4_ = VariableLength;
  bVar6 = ::operator!=(&bg,(BrushStyle *)local_58);
  if (bVar6) {
    pcStack_40 = (char *)CONCAT44(uStack_8c,uStack_90);
    local_58._16_4_ = local_98;
    local_58._20_4_ = uStack_94;
    pQVar13 = (QTextFrame *)CONCAT44(uStack_94,local_98);
    local_58._0_4_ = local_a8._0_4_;
    local_58._4_4_ = local_a8._4_4_;
    local_58._8_4_ = local_a8._8_4_;
    local_58._12_4_ = local_a8._12_4_;
    if (inRootFrame) {
      QVar26 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
      pQVar13 = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_);
      if (QVar26.wd <= 0.0) {
        pQVar13 = QTextDocument::rootFrame
                            ((this->super_QAbstractTextDocumentLayoutPrivate).document);
        pQVar14 = ::data(pQVar13);
        pQVar13 = (QTextFrame *)
                  ((double)((pQVar14->size).width.val - (pQVar14->rightMargin).val) * 0.015625 -
                  (double)CONCAT44(local_58._4_4_,local_58._0_4_));
      }
    }
    local_58._16_8_ = pQVar13;
    bVar6 = QTextFormat::hasProperty((QTextFormat *)local_68,0x1060);
    if (!bVar6) {
      QBrush::QBrush(&local_f8,&bg);
      local_88.d = (Data *)local_a8._0_8_;
      local_88.ptr = (char16_t *)stack0xffffffffffffff60;
      local_e8.w = 0.0;
      local_e8.h = 0.0;
      local_e8.xp = 0.0;
      local_e8.yp = 0.0;
      fillBackground(painter,(QRectF *)local_58,&local_f8,(QPointF *)&local_88,&local_e8);
      QBrush::~QBrush(&local_f8);
    }
  }
  local_e8.xp = 0.0;
  local_e8.yp = 0.0;
  local_e8.w = 0.0;
  iVar7 = QTextBlock::position(bl);
  iVar8 = QTextBlock::length(bl);
  lVar20 = 0;
  selectionFormat = (QTextCharFormat *)0x0;
  for (uVar16 = 0; uVar16 < (ulong)(context->selections).d.size; uVar16 = uVar16 + 1) {
    pSVar2 = (context->selections).d.ptr;
    this_00 = (QTextCursor *)((long)&(pSVar2->cursor).d.d.ptr + lVar20);
    iVar9 = QTextCursor::selectionStart(this_00);
    TVar22 = iVar9 - iVar7;
    iVar10 = QTextCursor::selectionEnd(this_00);
    iVar21 = iVar10 - iVar7;
    if (((iVar9 < iVar10) && ((int)TVar22 < iVar8)) && (0 < iVar21)) {
      local_58._16_4_ = -0x55555556;
      local_58._20_4_ = 0xaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = -0x55555556;
      local_58._8_4_ = -0x55555556;
      local_58._12_4_ = -0x55555556;
      pQVar19 = (QTextFormat *)(local_58 + 8);
      QTextCharFormat::QTextCharFormat((QTextCharFormat *)pQVar19);
      local_58._4_4_ = iVar21 - TVar22;
      local_58._0_4_ = TVar22;
      QTextFormat::operator=
                (pQVar19,(QTextFormat *)((long)&(pSVar2->format).super_QTextFormat.d.d.ptr + lVar20)
                );
      QList<QTextLayout::FormatRange>::emplaceBack<QTextLayout::FormatRange_const&>
                ((QList<QTextLayout::FormatRange> *)&local_e8,(FormatRange *)local_58);
      QTextFormat::~QTextFormat(pQVar19);
    }
    else {
      bVar6 = QTextCursor::hasSelection(this_00);
      if (!bVar6) {
        pQVar19 = (QTextFormat *)((long)&(pSVar2->format).super_QTextFormat.d.d.ptr + lVar20);
        bVar6 = QTextFormat::hasProperty(pQVar19,0x6000);
        if (bVar6) {
          iVar9 = QTextCursor::position(this_00);
          bVar6 = QTextBlock::contains(bl,iVar9);
          if (bVar6) {
            local_58._16_4_ = -0x55555556;
            local_58._20_4_ = 0xaaaaaaaa;
            local_58._0_4_ = 0xaaaaaaaa;
            local_58._4_4_ = -0x55555556;
            local_58._8_4_ = -0x55555556;
            local_58._12_4_ = -0x55555556;
            QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_58 + 8));
            local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            iVar9 = QTextCursor::position(this_00);
            QVar24 = QTextLayout::lineForTextPosition(this_02,iVar9 - iVar7);
            local_88.ptr = (char16_t *)QVar24.eng;
            local_88.d = (Data *)CONCAT44(local_88.d._4_4_,QVar24.index);
            local_58._0_4_ = QTextLine::textStart((QTextLine *)&local_88);
            local_58._4_4_ = QTextLine::textLength((QTextLine *)&local_88);
            if (local_58._0_4_ + local_58._4_4_ == iVar8 + -1) {
              local_58._4_4_ = local_58._4_4_ + 1;
            }
            QTextFormat::operator=((QTextFormat *)(local_58 + 8),pQVar19);
            QList<QTextLayout::FormatRange>::emplaceBack<QTextLayout::FormatRange_const&>
                      ((QList<QTextLayout::FormatRange> *)&local_e8,(FormatRange *)local_58);
            QTextFormat::~QTextFormat((QTextFormat *)(local_58 + 8));
          }
        }
      }
    }
    pQVar15 = (QTextCharFormat *)((long)&(pSVar2->format).super_QTextFormat.d.d.ptr + lVar20);
    if (iVar21 < 1) {
      pQVar15 = selectionFormat;
    }
    if ((int)TVar22 < 0) {
      selectionFormat = pQVar15;
    }
    lVar20 = lVar20 + 0x18;
  }
  this_01 = (this->super_QAbstractTextDocumentLayoutPrivate).document;
  QTextBlock::blockFormat((QTextBlock *)local_58);
  pQVar17 = QTextDocument::objectForFormat(this_01,(QTextFormat *)local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  if (pQVar17 != (QTextObject *)0x0) {
    QTextObject::format((QTextObject *)&local_88);
    QTextFormat::toListFormat((QTextFormat *)local_58);
    SVar11 = QTextListFormat::style((QTextListFormat *)local_58);
    QTextFormat::~QTextFormat((QTextFormat *)local_58);
    QTextFormat::~QTextFormat((QTextFormat *)&local_88);
    if (SVar11 != ListStyleUndefined) {
      drawListItem(this,offset,painter,context,bl,selectionFormat);
    }
  }
  oldPen.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  p = QPainter::pen(painter);
  QPen::QPen(&oldPen,p);
  pQVar18 = QPalette::color(&context->palette,Text);
  QPainter::setPen(painter,pQVar18);
  if (((context->clip).w <= 0.0) || ((context->clip).h <= 0.0)) {
    qVar3 = (this->clipRect).xp;
    qVar5 = (this->clipRect).yp;
    local_58._16_8_ = (this->clipRect).w;
    pcStack_40 = (char *)(this->clipRect).h;
    local_58._0_4_ = SUB84(qVar3,0);
    local_58._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
    local_58._8_4_ = SUB84(qVar5,0);
    local_58._12_4_ = (undefined4)((ulong)qVar5 >> 0x20);
  }
  else {
    QRectF::operator&((QRectF *)local_58,(QRectF *)&context->clip);
  }
  QTextLayout::draw(this_02,painter,offset,(QList<QTextLayout::FormatRange> *)&local_e8,
                    (QRectF *)local_58);
  frameIteratorForTextPosition((Iterator *)local_58,this,iVar7);
  bVar6 = isEmptyBlockBeforeTable((Iterator *)local_58);
  if (!bVar6) {
    iVar9 = context->cursorPosition;
    if (iVar9 < iVar7 || iVar8 + iVar7 <= iVar9) {
      if (iVar9 < -1) {
        QTextLayout::preeditAreaText((QString *)&local_88,this_02);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        if (local_88.size != 0) {
          iVar9 = context->cursorPosition;
          goto LAB_00472ffc;
        }
      }
    }
    else {
LAB_00472ffc:
      if (iVar9 < -1) {
        iVar7 = QTextLayout::preeditAreaPosition(this_02);
        iVar9 = (iVar7 - iVar9) + -2;
      }
      else {
        iVar9 = iVar9 - iVar7;
      }
      QTextLayout::drawCursor(this_02,painter,offset,iVar9,this->cursorWidth);
    }
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)local_68,0x1060);
  if (bVar6) {
    QVar27 = QTextFormat::lengthProperty((QTextFormat *)local_68,0x1060);
    local_58._0_4_ = QVar27.lengthType;
    local_58._8_4_ = QVar27.fixedValueOrPercentage._0_4_;
    local_58._12_4_ = QVar27.fixedValueOrPercentage._4_4_;
    qVar3 = QTextLength::value((QTextLength *)local_58,(qreal)CONCAT44(uStack_94,local_98));
    bVar6 = QTextFormat::hasProperty((QTextFormat *)local_68,0x820);
    if (bVar6) {
      QTextFormat::property((QVariant *)local_58,(QTextFormat *)local_68,0x820);
      qvariant_cast<QBrush>((QVariant *)local_108);
      local_88.d = *(Data **)((long)local_108 + 8);
      local_88.ptr = *(char16_t **)((long)local_108 + 0x10);
      QBrush::~QBrush((QBrush *)local_108);
      ::QVariant::~QVariant((QVariant *)local_58);
    }
    else {
      pQVar18 = QPalette::color(&context->palette,Inactive,WindowText);
      local_88.d = *(Data **)pQVar18;
      local_88.ptr = *(char16_t **)((long)&pQVar18->ct + 4);
    }
    QPainter::setPen(painter,(QColor *)&local_88);
    pcVar23 = (char *)((double)stack0xffffffffffffff60 + (double)CONCAT44(uStack_8c,uStack_90));
    iVar7 = QTextBlock::length(bl);
    if (iVar7 == 1) {
      pcVar23 = (char *)((double)CONCAT44(uStack_8c,uStack_90) * 0.5 +
                        (double)stack0xffffffffffffff60);
    }
    dVar4 = (double)CONCAT44(uStack_94,local_98) * 0.5 + (double)local_a8._0_8_;
    local_58._0_8_ = dVar4 - qVar3 * 0.5;
    local_58._16_8_ = dVar4 + qVar3 * 0.5;
    local_58._8_4_ = SUB84(pcVar23,0);
    local_58._12_4_ = (undefined4)((ulong)pcVar23 >> 0x20);
    pcStack_40 = pcVar23;
    QPainter::drawLine(painter,(QLineF *)local_58);
  }
  QPainter::setPen(painter,&oldPen);
  QPen::~QPen(&oldPen);
  QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
            ((QArrayDataPointer<QTextLayout::FormatRange> *)&local_e8);
  QBrush::~QBrush(&bg);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
LAB_004731e6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawBlock(const QPointF &offset, QPainter *painter,
                                           const QAbstractTextDocumentLayout::PaintContext &context,
                                           const QTextBlock &bl, bool inRootFrame) const
{
    const QTextLayout *tl = bl.layout();
    QRectF r = tl->boundingRect();
    r.translate(offset + tl->position());
    if (!bl.isVisible() || (context.clip.isValid() && (r.bottom() < context.clip.y() || r.top() > context.clip.bottom())))
        return;
    qCDebug(lcDraw) << "drawBlock" << bl.position() << "at" << offset << "br" << tl->boundingRect();

    QTextBlockFormat blockFormat = bl.blockFormat();

    QBrush bg = blockFormat.background();
    if (bg != Qt::NoBrush) {
        QRectF rect = r;

        // extend the background rectangle if we're in the root frame with NoWrap,
        // as the rect of the text block will then be only the width of the text
        // instead of the full page width
        if (inRootFrame && document->pageSize().width() <= 0) {
            const QTextFrameData *fd = data(document->rootFrame());
            rect.setRight((fd->size.width - fd->rightMargin).toReal());
        }

        // in the case of <hr>, the background-color CSS style fills only the rule's thickness instead of the whole line
        if (!blockFormat.hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth))
            fillBackground(painter, rect, bg, r.topLeft());
    }

    QList<QTextLayout::FormatRange> selections;
    int blpos = bl.position();
    int bllen = bl.length();
    const QTextCharFormat *selFormat = nullptr;
    for (int i = 0; i < context.selections.size(); ++i) {
        const QAbstractTextDocumentLayout::Selection &range = context.selections.at(i);
        const int selStart = range.cursor.selectionStart() - blpos;
        const int selEnd = range.cursor.selectionEnd() - blpos;
        if (selStart < bllen && selEnd > 0
             && selEnd > selStart) {
            QTextLayout::FormatRange o;
            o.start = selStart;
            o.length = selEnd - selStart;
            o.format = range.format;
            selections.append(o);
        } else if (! range.cursor.hasSelection() && range.format.hasProperty(QTextFormat::FullWidthSelection)
                   && bl.contains(range.cursor.position())) {
            // for full width selections we don't require an actual selection, just
            // a position to specify the line. that's more convenience in usage.
            QTextLayout::FormatRange o;
            QTextLine l = tl->lineForTextPosition(range.cursor.position() - blpos);
            o.start = l.textStart();
            o.length = l.textLength();
            if (o.start + o.length == bllen - 1)
                ++o.length; // include newline
            o.format = range.format;
            selections.append(o);
       }
        if (selStart < 0 && selEnd >= 1)
            selFormat = &range.format;
    }

    QTextObject *object = document->objectForFormat(bl.blockFormat());
    if (object && object->format().toListFormat().style() != QTextListFormat::ListStyleUndefined)
        drawListItem(offset, painter, context, bl, selFormat);

    QPen oldPen = painter->pen();
    painter->setPen(context.palette.color(QPalette::Text));

    tl->draw(painter, offset, selections, context.clip.isValid() ? (context.clip & clipRect) : clipRect);

    // if the block is empty and it precedes a table, do not draw the cursor.
    // the cursor is drawn later after the table has been drawn so no need
    // to draw it here.
    if (!isEmptyBlockBeforeTable(frameIteratorForTextPosition(blpos))
        && ((context.cursorPosition >= blpos && context.cursorPosition < blpos + bllen)
            || (context.cursorPosition < -1 && !tl->preeditAreaText().isEmpty()))) {
        int cpos = context.cursorPosition;
        if (cpos < -1)
            cpos = tl->preeditAreaPosition() - (cpos + 2);
        else
            cpos -= blpos;
        tl->drawCursor(painter, offset, cpos, cursorWidth);
    }

    if (blockFormat.hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth)) {
        const qreal width = blockFormat.lengthProperty(QTextFormat::BlockTrailingHorizontalRulerWidth).value(r.width());
        const auto color = blockFormat.hasProperty(QTextFormat::BackgroundBrush)
                         ? qvariant_cast<QBrush>(blockFormat.property(QTextFormat::BackgroundBrush)).color()
                         : context.palette.color(QPalette::Inactive, QPalette::WindowText);
        painter->setPen(color);
        qreal y = r.bottom();
        if (bl.length() == 1)
            y = r.top() + r.height() / 2;

        const qreal middleX = r.left() + r.width() / 2;
        painter->drawLine(QLineF(middleX - width / 2, y, middleX + width / 2, y));
    }

    painter->setPen(oldPen);
}